

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
boost::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,
                 dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ctype cVar2;
  long *plVar3;
  ulong uVar4;
  basic_ostream<char,_std::char_traits<char>_> bVar5;
  bool bVar6;
  int iVar7;
  ctype *pcVar8;
  long lVar9;
  size_type pos;
  long lVar10;
  sentry cerberos;
  ctype local_66;
  ctype local_65;
  locale local_50 [8];
  ulong local_48;
  sentry local_40 [16];
  
  std::ostream::sentry::sentry(local_40,os);
  if (local_40[0] != (sentry)0x1) goto LAB_001249ec;
  std::locale::locale(local_50,(locale *)(os + *(long *)(*(long *)os + -0x18) + 0xd0));
  pcVar8 = std::use_facet<std::ctype<char>>(local_50);
  std::locale::~locale(local_50);
  if (pcVar8[0x38] == (ctype)0x0) {
    std::ctype<char>::_M_widen_init();
    local_65 = (ctype)(**(code **)(*(long *)pcVar8 + 0x30))(pcVar8,0x30);
    if (pcVar8[0x38] != (ctype)0x0) goto LAB_00124831;
    std::ctype<char>::_M_widen_init();
    local_66 = (ctype)(**(code **)(*(long *)pcVar8 + 0x30))(pcVar8,0x31);
  }
  else {
    local_65 = pcVar8[0x69];
LAB_00124831:
    local_66 = pcVar8[0x6a];
  }
  lVar10 = *(long *)(*(long *)os + -0x18);
  pbVar1 = os + lVar10;
  plVar3 = *(long **)(os + lVar10 + 0xe8);
  uVar4 = *(ulong *)(os + lVar10 + 0x10);
  local_48 = b->m_num_bits;
  lVar9 = uVar4 - local_48;
  if (uVar4 < local_48) {
    lVar9 = 0;
  }
  if ((long)uVar4 < 1) {
    lVar9 = 0;
  }
  if (os[lVar10 + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x1) {
    bVar5 = pbVar1[0xe0];
  }
  else {
    bVar5 = (basic_ostream<char,_std::char_traits<char>_>)std::ios::widen((char)pbVar1);
    pbVar1[0xe0] = bVar5;
    pbVar1[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
    lVar10 = *(long *)(*(long *)os + -0x18);
  }
  if ((0 < lVar9) && ((*(uint *)(os + lVar10 + 0x18) & 0xb0) != 0x20)) {
    lVar9 = 0;
    lVar10 = 0;
    if (local_48 <= uVar4) {
      lVar10 = uVar4 - local_48;
    }
    lVar10 = lVar10 + 1;
    do {
      if ((basic_ostream<char,_std::char_traits<char>_> *)plVar3[5] <
          (basic_ostream<char,_std::char_traits<char>_> *)plVar3[6]) {
        *(basic_ostream<char,_std::char_traits<char>_> *)plVar3[5] = bVar5;
        plVar3[5] = plVar3[5] + 1;
      }
      else {
        iVar7 = (**(code **)(*plVar3 + 0x68))(plVar3,bVar5);
        if (iVar7 == -1) goto LAB_001249ab;
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  pos = b->m_num_bits;
  do {
    while( true ) {
      if (pos == 0) {
        if (lVar9 < 1) goto LAB_001249d7;
        lVar9 = lVar9 + 1;
        goto LAB_0012497d;
      }
      pos = pos - 1;
      bVar6 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(b,pos);
      cVar2 = local_66;
      if (!bVar6) {
        cVar2 = local_65;
      }
      if ((ctype *)plVar3[6] <= (ctype *)plVar3[5]) break;
      *(ctype *)plVar3[5] = cVar2;
      plVar3[5] = plVar3[5] + 1;
    }
    iVar7 = (**(code **)(*plVar3 + 0x68))(plVar3,cVar2);
  } while (iVar7 != -1);
LAB_001249ab:
  lVar10 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar10 + -0x18) + 0x10) = 0;
  std::ios::clear((int)os + (int)*(undefined8 *)(lVar10 + -0x18));
LAB_001249ec:
  std::ostream::sentry::~sentry(local_40);
  return os;
  while (lVar9 = lVar9 + -1, 1 < lVar9) {
LAB_0012497d:
    if ((basic_ostream<char,_std::char_traits<char>_> *)plVar3[5] <
        (basic_ostream<char,_std::char_traits<char>_> *)plVar3[6]) {
      *(basic_ostream<char,_std::char_traits<char>_> *)plVar3[5] = bVar5;
      plVar3[5] = plVar3[5] + 1;
    }
    else {
      iVar7 = (**(code **)(*plVar3 + 0x68))(plVar3,bVar5);
      if (iVar7 == -1) goto LAB_001249ab;
    }
  }
LAB_001249d7:
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  goto LAB_001249ec;
}

Assistant:

std::basic_ostream<Ch, Tr>&
operator<<(std::basic_ostream<Ch, Tr>& os,
           const dynamic_bitset<Block, Alloc>& b)
{

    using namespace std;

    const ios_base::iostate ok = ios_base::goodbit;
    ios_base::iostate err = ok;

    typename basic_ostream<Ch, Tr>::sentry cerberos(os);
    if (cerberos) {

        BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, os.getloc());
        const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
        const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

        BOOST_TRY {

            typedef typename dynamic_bitset<Block, Alloc>::size_type bitset_size_type;
            typedef basic_streambuf<Ch, Tr> buffer_type;

            buffer_type * buf = os.rdbuf();
            // careful: os.width() is signed (and can be < 0)
            const bitset_size_type width = (os.width() <= 0) ? 0 : static_cast<bitset_size_type>(os.width());
            streamsize npad = (width <= b.size()) ? 0 : width - b.size();

            const Ch fill_char = os.fill();
            const ios_base::fmtflags adjustfield = os.flags() & ios_base::adjustfield;

            // if needed fill at left; pad is decreased along the way
            if (adjustfield != ios_base::left) {
                for (; 0 < npad; --npad)
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                          err |= ios_base::failbit;
                          break;
                    }
            }

            if (err == ok) {
                // output the bitset
                for (bitset_size_type i = b.size(); 0 < i; --i) {
                    typename buffer_type::int_type
                        ret = buf->sputc(b.test(i-1)? one : zero);
                    if (Tr::eq_int_type(Tr::eof(), ret)) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }

            if (err == ok) {
                // if needed fill at right
                for (; 0 < npad; --npad) {
                    if (Tr::eq_int_type(Tr::eof(), buf->sputc(fill_char))) {
                        err |= ios_base::failbit;
                        break;
                    }
                }
            }


            os.width(0);

        } BOOST_CATCH (...) { // see std 27.6.1.1/4
            bool rethrow = false;
            BOOST_TRY { os.setstate(ios_base::failbit); } BOOST_CATCH (...) { rethrow = true; } BOOST_CATCH_END

            if (rethrow)
                BOOST_RETHROW;
        }